

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskIndex.cpp
# Opt level: O3

void OnDiskIndex::on_disk_merge_core
               (vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_> *indexes,RawFile *out,
               TaskSpec *task)

{
  size_t *psVar1;
  pointer puVar2;
  pointer pIVar3;
  size_t __nbytes;
  unsigned_long *buf;
  void *__s;
  uint64_t uVar4;
  runtime_error *this;
  IndexMergeHelper *ndx;
  long lVar5;
  void *__buf;
  ulong uVar6;
  __off_t in_R8;
  FileId base;
  void *pvVar7;
  uint uVar8;
  ulong uVar9;
  value_type *__val;
  IndexMergeHelper *ndx_1;
  pointer pIVar10;
  vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_> *__range3;
  PosixRunWriter writer;
  unsigned_long local_b0;
  PosixRunWriter local_60;
  
  buf = (unsigned_long *)operator_new(0x8000008);
  uVar9 = 0;
  memset(buf,0,0x8000008);
  __s = operator_new(0x40000000);
  memset(__s,0,0x40000000);
  local_60.fd_ = out->fd;
  local_60.out_bytes_ = 0;
  local_60.prev_ = -1;
  local_60.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_60.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b0 = 0x10;
  do {
    uVar4 = find_max_batch(indexes,(uint32_t)uVar9,0x40000000);
    if (uVar4 == 0) {
      spdlog::error<char[46]>((char (*) [46])"Merge too big, can\'t fit into MAX_BATCH_BYTES");
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Can\'t merge, batch size too big");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pIVar3 = (indexes->super__Vector_base<IndexMergeHelper,_std::allocator<IndexMergeHelper>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    pvVar7 = __s;
    for (pIVar10 = (indexes->super__Vector_base<IndexMergeHelper,_std::allocator<IndexMergeHelper>_>
                   )._M_impl.super__Vector_impl_data._M_start; pIVar10 != pIVar3;
        pIVar10 = pIVar10 + 1) {
      psVar1 = (pIVar10->run_offset_cache).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start + uVar9;
      __nbytes = *psVar1;
      __buf = (void *)(psVar1[uVar4] - __nbytes);
      RawFile::pread(&pIVar10->index->ndxfile,(int)pvVar7,__buf,__nbytes,in_R8);
      pvVar7 = (void *)((long)pvVar7 + (long)__buf);
    }
    uVar8 = (uint)uVar4;
    if (0 < (int)uVar8) {
      uVar6 = 0;
      do {
        buf[uVar9 + uVar6] = local_b0;
        pIVar10 = (indexes->super__Vector_base<IndexMergeHelper,_std::allocator<IndexMergeHelper>_>)
                  ._M_impl.super__Vector_impl_data._M_start;
        pIVar3 = (indexes->super__Vector_base<IndexMergeHelper,_std::allocator<IndexMergeHelper>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        if (pIVar10 != pIVar3) {
          base = 0;
          lVar5 = 0;
          do {
            puVar2 = (pIVar10->run_offset_cache).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar9;
            PosixRunWriter::write_raw
                      (&local_60,base,(uint8_t *)((long)__s + (puVar2[uVar6] - *puVar2) + lVar5),
                       (uint8_t *)((long)__s + (puVar2[uVar6 + 1] - *puVar2) + lVar5));
            puVar2 = (pIVar10->run_offset_cache).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar9;
            lVar5 = (lVar5 - *puVar2) + puVar2[uVar4];
            base = base + pIVar10->file_count;
            pIVar10 = pIVar10 + 1;
          } while (pIVar10 != pIVar3);
        }
        local_b0 = local_b0 + local_60.out_bytes_;
        local_60.out_bytes_ = 0;
        local_60.prev_ = -1;
        uVar6 = uVar6 + 1;
      } while (uVar6 != (uVar8 & 0x7fffffff));
    }
    if (task != (TaskSpec *)0x0) {
      LOCK();
      (task->work_done_).super___atomic_base<unsigned_long>._M_i =
           (task->work_done_).super___atomic_base<unsigned_long>._M_i + uVar4;
      UNLOCK();
    }
    uVar8 = (uint32_t)uVar9 + uVar8;
    uVar9 = (ulong)uVar8;
  } while (uVar8 < 0x1000000);
  PosixRunWriter::flush(&local_60);
  buf[0x1000000] = local_b0;
  RawFile::write<unsigned_long>(out,buf,0x1000001);
  PosixRunWriter::~PosixRunWriter(&local_60);
  operator_delete(__s,0x40000000);
  operator_delete(buf,0x8000008);
  return;
}

Assistant:

void OnDiskIndex::on_disk_merge_core(
    const std::vector<IndexMergeHelper> &indexes, RawFile *out,
    TaskSpec *task) {
    // Offsets to every run in the file (including the header).
    std::vector<uint64_t> offsets(NUM_TRIGRAMS + 1);

    // Current offset in the file (equal to size of the header intially).
    uint64_t out_offset = 16;

    // Arbitrary number describing how much RAM we want to spend on the run
    // cache during the batched stream pass.
    constexpr uint64_t MAX_BATCH_BYTES = 1024ULL * 1024ULL * 1024ULL;

    // Vector used for all merge passes (to avoid unnecessary reallocations).
    std::vector<uint8_t> batch_vector(MAX_BATCH_BYTES);
    uint8_t *batch_data = batch_vector.data();

    PosixRunWriter writer(out->get());

    // Main merge loop.
    TriGram trigram = 0;
    while (trigram < NUM_TRIGRAMS) {
        uint64_t batch_size = find_max_batch(indexes, trigram, MAX_BATCH_BYTES);

        if (batch_size == 0) {
            // TODO(unknown): fallback to old unbatched merge method.
            spdlog::error("Merge too big, can't fit into MAX_BATCH_BYTES");
            throw std::runtime_error("Can't merge, batch size too big");
        }

        // Read batch_size runs at once.
        uint8_t *batch_ptr = batch_data;
        for (const auto &ndx : indexes) {
            OnDiskRun run = ndx.run(trigram, batch_size);
            ndx.index->ndxfile.pread(batch_ptr, run.size(), run.start());
            batch_ptr += run.size();
        }

        // Write the runs to the output file in a proper order.
        for (int i = 0; i < static_cast<int>(batch_size); i++) {
            offsets[trigram + i] = out_offset;
            uint64_t base_bytes = 0;
            FileId base_files = 0;
            for (const auto &ndx : indexes) {
                uint8_t *run_base = batch_data + base_bytes;
                uint8_t *run_start = run_base + ndx.run(trigram, i).size();
                uint8_t *run_end = run_base + ndx.run(trigram, i + 1).size();
                writer.write_raw(base_files, run_start, run_end);
                base_bytes += ndx.run(trigram, batch_size).size();
                base_files += ndx.file_count;
            }
            out_offset += writer.bytes_written();
            writer.reset();
        }

        // Bookkeeping - update progress and current trigram ndx.
        if (task != nullptr) {
            task->add_progress(batch_size);
        }
        trigram += batch_size;
    }
    writer.flush();

    // Write the footer - 128MB header with run offsets.
    offsets[NUM_TRIGRAMS] = out_offset;
    out->write<uint64_t>(offsets.data(), offsets.size());
}